

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall deqp::gls::LongStressCaseInternal::Program::build(Program *this,TestLog *log)

{
  byte bVar1;
  TestLog *pTVar2;
  TestError *this_00;
  deUint32 extraout_EDX;
  deUint32 extraout_EDX_00;
  deUint32 programGL;
  deUint32 shaderGL;
  deUint32 shaderGL_00;
  bool local_191;
  bool local_183;
  allocator<char> local_181;
  string local_180;
  string local_160;
  LogShader local_140;
  string local_f0;
  LogShader local_d0;
  byte local_6a;
  allocator<char> local_69;
  string local_68;
  LogShaderProgram local_48;
  bool local_1c;
  bool local_1b;
  byte local_1a;
  byte local_19;
  bool linkOk;
  bool attemptLink;
  bool fragCompileOk;
  TestLog *pTStack_18;
  bool vertCompileOk;
  TestLog *log_local;
  Program *this_local;
  
  pTStack_18 = log;
  log_local = (TestLog *)this;
  local_19 = compileShader(this->m_vertShaderGL);
  local_1a = compileShader(this->m_fragShaderGL);
  local_183 = false;
  if ((local_19 & 1) != 0) {
    local_183 = (bool)local_1a;
  }
  local_1b = local_183;
  local_191 = false;
  programGL = extraout_EDX;
  if (local_183 != false) {
    local_191 = linkProgram(this->m_programGL);
    programGL = extraout_EDX_00;
  }
  pTVar2 = pTStack_18;
  local_1c = local_191;
  if ((((local_19 & 1) != 0) && ((local_1a & 1) != 0)) && (local_191 != false)) {
    this->m_isBuilt = true;
    return;
  }
  local_6a = 0;
  if ((local_1b & 1U) == 0) {
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  }
  else {
    getProgramInfoLog_abi_cxx11_(&local_68,(gls *)(ulong)this->m_programGL,programGL);
  }
  tcu::LogShaderProgram::LogShaderProgram(&local_48,local_191,&local_68);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_48);
  bVar1 = local_19;
  getShaderInfoLog_abi_cxx11_(&local_f0,(gls *)(ulong)this->m_vertShaderGL,shaderGL);
  tcu::LogShader::LogShader
            (&local_d0,QP_SHADER_TYPE_VERTEX,&this->m_vertSource,(bool)(bVar1 & 1),&local_f0);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_d0);
  bVar1 = local_1a;
  getShaderInfoLog_abi_cxx11_(&local_160,(gls *)(ulong)this->m_fragShaderGL,shaderGL_00);
  tcu::LogShader::LogShader
            (&local_140,QP_SHADER_TYPE_FRAGMENT,&this->m_fragSource,(bool)(bVar1 & 1),&local_160);
  pTVar2 = tcu::TestLog::operator<<(pTVar2,&local_140);
  tcu::TestLog::operator<<(pTVar2,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  tcu::LogShader::~LogShader(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  tcu::LogShader::~LogShader(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  tcu::LogShaderProgram::~LogShaderProgram(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator(&local_69);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"Program build failed",&local_181);
  tcu::TestError::TestError(this_00,&local_180);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void Program::build (TestLog& log)
{
	DE_ASSERT(m_hasSources);

	const bool vertCompileOk	= compileShader(m_vertShaderGL);
	const bool fragCompileOk	= compileShader(m_fragShaderGL);
	const bool attemptLink		= vertCompileOk && fragCompileOk;
	const bool linkOk			= attemptLink && linkProgram(m_programGL);

	if (!(vertCompileOk && fragCompileOk && linkOk))
	{
		log << TestLog::ShaderProgram(linkOk, attemptLink ? getProgramInfoLog(m_programGL) : string(""))
			<< TestLog::Shader(QP_SHADER_TYPE_VERTEX, m_vertSource, vertCompileOk, getShaderInfoLog(m_vertShaderGL))
			<< TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, m_fragSource, fragCompileOk, getShaderInfoLog(m_fragShaderGL))
			<< TestLog::EndShaderProgram;

		throw tcu::TestError("Program build failed");
	}

	m_isBuilt = true;
}